

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewLine(void)

{
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiWindow *local_10;
  ImGuiWindow *window;
  
  local_10 = GetCurrentWindow();
  if ((local_10->SkipItems & 1U) == 0) {
    if ((local_10->DC).CurrentLineHeight <= 0.0) {
      ImVec2::ImVec2(&local_20,0.0,GImGui->FontSize);
      ItemSize(&local_20,0.0);
    }
    else {
      ImVec2::ImVec2(&local_18,0.0,0.0);
      ItemSize(&local_18,0.0);
    }
  }
  return;
}

Assistant:

void ImGui::NewLine()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;
    if (window->DC.CurrentLineHeight > 0.0f)     // In the event that we are on a line with items that is smaller that FontSize high, we will preserve its height.
        ItemSize(ImVec2(0,0));
    else
        ItemSize(ImVec2(0.0f, GImGui->FontSize));
}